

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

string * __thiscall
flatbuffers::FlatBufMethod::GRPCType_abi_cxx11_
          (string *__return_storage_ptr__,FlatBufMethod *this,StructDef *sd)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"flatbuffers::grpc::Message<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sd);
  std::operator+(__return_storage_ptr__,&local_30,">");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GRPCType(const StructDef &sd) const {
    return "flatbuffers::grpc::Message<" + sd.name + ">";
  }